

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PrimitiveExpression.h
# Opt level: O1

ptr<Value> __thiscall
PrimitiveExpression<Integer>::evaluate(PrimitiveExpression<Integer> *this,Environment *env)

{
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var1;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *__tmp;
  _func_int **pp_Var2;
  ptr<Value> pVar3;
  
  pp_Var2 = (_func_int **)operator_new(0x20);
  pp_Var2[1] = (_func_int *)0x100000001;
  *pp_Var2 = (_func_int *)&PTR___Sp_counted_ptr_inplace_0012f548;
  pp_Var2[2] = (_func_int *)&PTR__Member_0012f598;
  _Var1._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                (env->symbols)._M_h._M_before_begin._M_nxt;
  pp_Var2[3] = (_func_int *)_Var1._M_pi;
  (this->super_Expression)._vptr_Expression = pp_Var2 + 2;
  (this->value).super_Value.super_Member._vptr_Member = pp_Var2;
  pVar3.super___shared_ptr<Value,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi = _Var1._M_pi;
  pVar3.super___shared_ptr<Value,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)this;
  return (ptr<Value>)pVar3.super___shared_ptr<Value,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

ptr<Value> evaluate(Environment *env) override {
        return make<T>(value);
    }